

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor_math.hpp
# Opt level: O3

taylor<double,_1,_2> *
operator/(taylor<double,_1,_2> *__return_storage_ptr__,int *x,taylor<double,_1,_2> *t)

{
  int iVar1;
  int i;
  long lVar2;
  taylor<double,_1,_2> *extraout_RAX;
  taylor<double,_1,_2> tmp;
  taylor<double,_1,_2> local_58;
  double local_38;
  double dStack_30;
  double local_28;
  
  local_58.super_polynomial<double,_1,_2>.c[0] = 0.0;
  local_58.super_polynomial<double,_1,_2>.c[1] = 0.0;
  local_58.super_polynomial<double,_1,_2>.c[2] = 0.0;
  inv_taylor<double,2>(&local_58,(double *)x);
  iVar1 = *x;
  lVar2 = 0;
  do {
    local_58.super_polynomial<double,_1,_2>.c[lVar2] =
         local_58.super_polynomial<double,_1,_2>.c[lVar2] * (double)iVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  dStack_30 = (t->super_polynomial<double,_1,_2>).c[1];
  local_28 = (t->super_polynomial<double,_1,_2>).c[2];
  local_38 = 0.0;
  (__return_storage_ptr__->super_polynomial<double,_1,_2>).c[1] =
       local_58.super_polynomial<double,_1,_2>.c[2] * dStack_30 + 0.0;
  (__return_storage_ptr__->super_polynomial<double,_1,_2>).c[0] =
       local_58.super_polynomial<double,_1,_2>.c[1];
  (__return_storage_ptr__->super_polynomial<double,_1,_2>).c[2] = 0.0;
  polymul_internal::taylor_inplace_multiplier<double,_1,_2,_2,_0>::mul
            ((double *)__return_storage_ptr__,&local_38);
  (__return_storage_ptr__->super_polynomial<double,_1,_2>).c[0] =
       local_58.super_polynomial<double,_1,_2>.c[0];
  return extraout_RAX;
}

Assistant:

static taylor<T, Nvar, Ndeg> operator/(const S & x,
                                       const taylor<T, Nvar, Ndeg> & t) {
#ifdef TAYLOR_LOGGING
  if (taylor_logging)
    cout << "operator/ S templated. x = " << x << endl;
#endif
  taylor<T, 1, Ndeg> tmp;
  inv_taylor(tmp, t[0]);
  tmp *= x;
  taylor<T, Nvar, Ndeg> res;
  t.compose(res, tmp);
  return res;
}